

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O3

features ** __thiscall
v_hashmap<substring,_features_*>::get
          (v_hashmap<substring,_features_*> *this,substring *key,uint64_t hash)

{
  long lVar1;
  code *pcVar2;
  char cVar3;
  ulong uVar4;
  vw_exception *this_00;
  ulong uVar5;
  ulong uVar6;
  stringstream __msg;
  string sStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  uVar6 = (*(long *)(this + 0x28) - *(long *)(this + 0x18) >> 3) * -0x3333333333333333;
  uVar5 = hash % uVar6;
  *(ulong *)(this + 0x38) = uVar5;
  uVar4 = uVar5;
  do {
    if (*(char *)(*(long *)(this + 0x18) + uVar4 * 0x28) == '\0') {
      return (features **)(this + 0x10);
    }
    lVar1 = *(long *)(this + 0x18) + uVar4 * 0x28;
    if (*(uint64_t *)(lVar1 + 0x20) == hash) {
      pcVar2 = *(code **)this;
      if (pcVar2 == (code *)0x0 && *(code **)(this + 8) == (code *)0x0) {
LAB_00134f1a:
        return (features **)(*(long *)(this + 0x18) + *(long *)(this + 0x38) * 0x28 + 0x18);
      }
      if (pcVar2 == (code *)0x0) {
        cVar3 = (**(code **)(this + 8))(key,lVar1 + 8);
      }
      else {
        cVar3 = (*pcVar2)(*(undefined8 *)(this + 0x48),key);
      }
      if (cVar3 != '\0') goto LAB_00134f1a;
    }
    uVar4 = *(long *)(this + 0x38) + 1U;
    if (uVar6 <= *(long *)(this + 0x38) + 1U) {
      uVar4 = 0;
    }
    *(ulong *)(this + 0x38) = uVar4;
    if (uVar4 == uVar5) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a8,"error: v_hashmap did not grow enough!",0x25);
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/v_hashmap.h"
                 ,0xe2,&sStack_1d8);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  } while( true );
}

Assistant:

V& get(const K& key, uint64_t hash)
  {
    size_t sz = base_size();
    size_t first_position = hash % sz;
    last_position = first_position;
    while (true)
    {  // if there's nothing there, obviously we don't contain it
      if (!dat[last_position].occupied)
        return default_value;

      // there's something there: maybe it's us
      if ((dat[last_position].hash == hash) && is_equivalent(key, dat[last_position].key))
        return dat[last_position].val;

      // there's something there that's NOT us -- advance pointer
      // cerr << "+";
      // num_linear_steps++;
      last_position++;
      if (last_position >= sz)
        last_position = 0;

      // check to make sure we haven't cycled around -- this is a bug!
      if (last_position == first_position)
        THROW("error: v_hashmap did not grow enough!");
    }
  }